

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.h
# Opt level: O3

bool re2::ParseInteger(StringPiece *s,int *np)

{
  byte *pbVar1;
  size_type sVar2;
  int iVar3;
  
  sVar2 = s->size_;
  if (sVar2 != 0) {
    pbVar1 = (byte *)s->data_;
    if ((*pbVar1 - 0x30 < 10) && ((*pbVar1 != 0x30 || sVar2 == 1 || (9 < pbVar1[1] - 0x30)))) {
      iVar3 = 0;
      do {
        sVar2 = sVar2 - 1;
        if (9 < *pbVar1 - 0x30) break;
        if (99999999 < iVar3) {
          return false;
        }
        iVar3 = (uint)*pbVar1 + iVar3 * 10 + -0x30;
        s->data_ = (const_pointer)(pbVar1 + 1);
        s->size_ = sVar2;
        pbVar1 = pbVar1 + 1;
      } while (sVar2 != 0);
      *np = iVar3;
      return true;
    }
  }
  return false;
}

Assistant:

size_type size() const { return size_; }